

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

void helicsCoreSetLogFile(HelicsCore core,char *logFileName,HelicsError *err)

{
  Core *pCVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  
  pCVar1 = getCore(core,err);
  if (pCVar1 != (Core *)0x0) {
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (logFileName != (char *)0x0) {
      sVar2 = strlen(logFileName);
      _Var3._M_p = logFileName;
    }
    (*pCVar1->_vptr_Core[0x59])(pCVar1,sVar2,_Var3._M_p);
  }
  return;
}

Assistant:

void helicsCoreSetLogFile(HelicsCore core, const char* logFileName, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    try {
        cppcore->setLogFile(AS_STRING_VIEW(logFileName));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}